

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEWriter.cpp
# Opt level: O2

BitMatrix * __thiscall
ZXing::OneD::UPCEWriter::encode
          (BitMatrix *__return_storage_ptr__,UPCEWriter *this,string *contents,int width,int height)

{
  undefined4 in_register_0000000c;
  string_view utf8;
  wstring wStack_48;
  
  utf8._M_str._4_4_ = in_register_0000000c;
  utf8._M_str._0_4_ = width;
  utf8._M_len = (size_t)(contents->_M_dataplus)._M_p;
  FromUtf8_abi_cxx11_(&wStack_48,(ZXing *)contents->_M_string_length,utf8);
  encode(__return_storage_ptr__,this,&wStack_48,width,height);
  std::__cxx11::wstring::~wstring((wstring *)&wStack_48);
  return __return_storage_ptr__;
}

Assistant:

BitMatrix UPCEWriter::encode(const std::string& contents, int width, int height) const
{
	return encode(FromUtf8(contents), width, height);
}